

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::AddContextHook(ImGuiContext_conflict *ctx,ImGuiContextHook *hook)

{
  ImGuiContextHook *pIVar1;
  ImGuiID IVar2;
  bool bVar3;
  ImGuiContext_conflict *g;
  ImGuiContextHook *hook_local;
  ImGuiContext_conflict *ctx_local;
  
  bVar3 = false;
  if ((hook->Callback != (ImGuiContextHookCallback)0x0) && (bVar3 = false, hook->HookId == 0)) {
    bVar3 = hook->Type != ImGuiContextHookType_PendingRemoval_;
  }
  if (!bVar3) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xdba,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  ImVector<ImGuiContextHook>::push_back(&ctx->Hooks,hook);
  IVar2 = ctx->HookIdNext + 1;
  ctx->HookIdNext = IVar2;
  pIVar1 = ImVector<ImGuiContextHook>::back(&ctx->Hooks);
  pIVar1->HookId = IVar2;
  return ctx->HookIdNext;
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}